

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O3

void __thiscall libchars::debug::initialize__(debug *this)

{
  char *__filename;
  
  if (_d_ != (FILE *)0x0) {
    fclose(_d_);
    _d_ = (FILE *)0x0;
  }
  if ((this->log_path)._M_string_length == 0) {
    __filename = "debug.log";
  }
  else {
    __filename = (this->log_path)._M_dataplus._M_p;
  }
  _d_ = fopen(__filename,"at");
  this->initialized = true;
  return;
}

Assistant:

void debug::initialize__()
    {
        if (_d_ != NULL) {
            fclose(_d_);
            _d_ = NULL;
        }

        if (!log_path.empty())
            _d_ = fopen(log_path.c_str(), "at");
        else
            _d_ = fopen(LC_LOG_DEFAULT_FILE, "at");

        initialized = true;
    }